

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseCommand(Parser *this)

{
  Tokenizer *pTVar1;
  Architecture *pAVar2;
  Token *token;
  Parser *in_RSI;
  pointer local_20;
  
  updateFileInfo(in_RSI);
  pTVar1 = (in_RSI->entries).
           super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].tokenizer;
  if (*(Tokenizer **)&pTVar1->position == pTVar1) {
    std::make_unique<DummyCommand>();
  }
  else {
    parseLabel((Parser *)&stack0xffffffffffffffe0);
    if (local_20 == (pointer)0x0) {
      if (in_RSI->error != true) {
        parseMacroCall((Parser *)&stack0xffffffffffffffe0);
        if (local_20 != (pointer)0x0) goto LAB_0013fec7;
        if (in_RSI->error != true) {
          pAVar2 = Architecture::current();
          (**pAVar2->_vptr_Architecture)(&stack0xffffffffffffffe0,pAVar2);
          if (local_20 != (pointer)0x0) goto LAB_0013fec7;
          if (in_RSI->error != true) {
            parseDirective((Parser *)&stack0xffffffffffffffe0,(DirectiveMap *)in_RSI);
            if (local_20 != (pointer)0x0) goto LAB_0013fec7;
            if (in_RSI->error != true) {
              pAVar2 = Architecture::current();
              (*pAVar2->_vptr_Architecture[1])(&stack0xffffffffffffffe0);
              if (local_20 != (pointer)0x0) goto LAB_0013fec7;
              if (in_RSI->error != true) {
                token = peekToken(in_RSI,0);
                printError<std::__cxx11::string>
                          (in_RSI,token,"Parse error \'%s\'",&token->originalText);
              }
            }
          }
        }
      }
      handleError(this);
      return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
             )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
               )this;
    }
  }
LAB_0013fec7:
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = local_20;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseCommand()
{
	std::unique_ptr<CAssemblerCommand> command;

	updateFileInfo();

	if (atEnd())
		return std::make_unique<DummyCommand>();

	if ((command = parseLabel()) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = parseMacroCall()) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = Architecture::current().parseDirective(*this)) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = parseDirective(directives)) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = Architecture::current().parseOpcode(*this)) != nullptr)
		return command;
	if (hasError())
		return handleError();

	const Token& token = peekToken();
	printError(token,"Parse error '%s'", token.getOriginalText());
	return handleError();
}